

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_cursor<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>::
basic_json_cursor<std::__cxx11::wstring_const&>
          (basic_json_cursor<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *source,
          basic_json_decode_options<wchar_t> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc,type *param_5)

{
  string_view_type sv;
  _Any_data local_50;
  code *local_40;
  
  *(undefined8 *)this = 0xb733d0;
  *(undefined8 *)(this + 0x188) = 0xb73470;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x20] = (basic_json_cursor<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>)0x1
  ;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             err_handler);
  basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
            ((basic_json_parser<wchar_t,_std::allocator<char>_> *)(this + 0x28),options,
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)&local_50,alloc)
  ;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(undefined ***)(this + 0x120) = &PTR__basic_json_visitor_00b73500;
  *(undefined2 *)(this + 0x128) = 3;
  *(undefined4 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x13c) = 0;
  *(undefined8 *)(this + 0x144) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  *(undefined8 *)(this + 0x160) = 0;
  *(undefined8 *)(this + 0x168) = 0;
  *(undefined8 *)(this + 0x170) = 0;
  *(undefined8 *)(this + 0x171) = 0;
  *(undefined8 *)(this + 0x179) = 0;
  this[0xa5] = (basic_json_cursor<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>)0x1
  ;
  sv._M_str = (source->_M_dataplus)._M_p;
  sv._M_len = source->_M_string_length;
  basic_json_cursor<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_>::
  initialize_with_string_view
            ((basic_json_cursor<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_> *)
             this,sv);
  return;
}

Assistant:

basic_json_cursor(Sourceable&& source, 
        const basic_json_decode_options<CharT>& options = basic_json_decode_options<CharT>(),
        std::function<bool(json_errc,const ser_context&)> err_handler = default_json_parsing(),
        const Allocator& alloc = Allocator(),
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options, err_handler, alloc)
    {
        parser_.cursor_mode(true);
        initialize_with_string_view(std::forward<Sourceable>(source));
    }